

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::write_exponent<char,fmt::v10::appender>(int exp,appender it)

{
  type tVar1;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> *pbVar2;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_88;
  char local_79;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_78;
  char local_69;
  char *local_68;
  char *d;
  char local_51;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_50;
  char local_41;
  char *local_40;
  char *top;
  value_type local_29;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_28;
  value_type local_1d;
  int local_1c;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bStack_18;
  int exp_local;
  appender it_local;
  
  local_1c = exp;
  bStack_18 = it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  if ((-10000 < exp) && (exp < 10000)) {
    if (exp < 0) {
      local_1d = '-';
      local_28.container =
           (buffer<char> *)appender::operator++((appender *)&stack0xffffffffffffffe8,0);
      pbVar2 = std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*(&local_28);
      std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=(pbVar2,&local_1d);
      local_1c = -local_1c;
    }
    else {
      local_29 = '+';
      top = (char *)appender::operator++((appender *)&stack0xffffffffffffffe8,0);
      pbVar2 = std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*
                         ((back_insert_iterator<fmt::v10::detail::buffer<char>_> *)&top);
      std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=(pbVar2,&local_29);
    }
    if (99 < local_1c) {
      tVar1 = to_unsigned<int>(local_1c / 100);
      local_40 = digits2((ulong)tVar1);
      if (999 < local_1c) {
        local_41 = *local_40;
        local_50.container =
             (buffer<char> *)appender::operator++((appender *)&stack0xffffffffffffffe8,0);
        pbVar2 = std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*(&local_50);
        std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=(pbVar2,&local_41);
      }
      local_51 = local_40[1];
      d = (char *)appender::operator++((appender *)&stack0xffffffffffffffe8,0);
      pbVar2 = std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*
                         ((back_insert_iterator<fmt::v10::detail::buffer<char>_> *)&d);
      std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=(pbVar2,&local_51);
      local_1c = local_1c % 100;
    }
    tVar1 = to_unsigned<int>(local_1c);
    local_68 = digits2((ulong)tVar1);
    local_69 = *local_68;
    local_78.container =
         (buffer<char> *)appender::operator++((appender *)&stack0xffffffffffffffe8,0);
    pbVar2 = std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*(&local_78);
    std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=(pbVar2,&local_69);
    local_79 = local_68[1];
    local_88.container =
         (buffer<char> *)appender::operator++((appender *)&stack0xffffffffffffffe8,0);
    pbVar2 = std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*(&local_88);
    std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=(pbVar2,&local_79);
    return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bStack_18.container;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/format.h"
              ,0x63d,"exponent out of range");
}

Assistant:

FMT_CONSTEXPR auto write_exponent(int exp, It it) -> It {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = digits2(to_unsigned(exp / 100));
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = digits2(to_unsigned(exp));
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}